

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerSpeed::DoEffect(APowerSpeed *this)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  double dVar2;
  bool bVar3;
  AActor *pAVar4;
  APlayerSpeedTrail *pAVar5;
  AActor *pAVar6;
  DVector3 local_38;
  
  APowerup::DoEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((((pAVar4 != (AActor *)0x0) &&
       (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar4->player != (player_t *)0x0)) &&
      (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), (pAVar4->player->cheats & 0x2000) == 0)) &&
     (((this->SpeedFlags & 1) == 0 && (((byte)level.time & 1) == 0)))) {
    do {
      this = (APowerSpeed *)
             GC::ReadBarrier<AInventory>
                       ((AInventory **)
                        &(this->super_APowerup).super_AInventory.super_AActor.Inventory);
      if (this == (APowerSpeed *)0x0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar2 = TVector3<double>::LengthSquared(&pAVar4->Vel);
        if (dVar2 <= 144.0) {
          return;
        }
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        local_38.X = (pAVar4->__Pos).X;
        local_38.Y = (pAVar4->__Pos).Y;
        local_38.Z = (pAVar4->__Pos).Z;
        pAVar5 = Spawn<APlayerSpeedTrail>(&local_38,NO_REPLACE);
        if (pAVar5 == (APlayerSpeedTrail *)0x0) {
          return;
        }
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        (pAVar5->super_AActor).Angles.Yaw.Degrees = (pAVar4->Angles).Yaw.Degrees;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        (pAVar5->super_AActor).Translation = pAVar4->Translation;
        (pAVar5->super_AActor).target.field_0.p = (AActor *)obj->field_0;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        (pAVar5->super_AActor).sprite = pAVar4->sprite;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        (pAVar5->super_AActor).frame = pAVar4->frame;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        (pAVar5->super_AActor).Floorclip = pAVar4->Floorclip;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar2 = (pAVar4->Scale).Y;
        (pAVar5->super_AActor).Scale.X = (pAVar4->Scale).X;
        (pAVar5->super_AActor).Scale.Y = dVar2;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
        pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar6 != pAVar4) {
          return;
        }
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((pAVar4->player->cheats & 0x20) != 0) {
          return;
        }
        pbVar1 = (byte *)((long)&(pAVar5->super_AActor).renderflags.Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        return;
      }
      bVar3 = DObject::IsKindOf((DObject *)this,RegistrationInfo.MyClass);
    } while ((!bVar3) || ((this->SpeedFlags & 1) != 0));
  }
  return;
}

Assistant:

void APowerSpeed::DoEffect ()
{
	Super::DoEffect ();
	
	if (Owner == NULL || Owner->player == NULL)
		return;

	if (Owner->player->cheats & CF_PREDICTING)
		return;

	if (SpeedFlags & PSF_NOTRAIL)
		return;

	if (level.time & 1)
		return;

	// Check if another speed item is present to avoid multiple drawing of the speed trail.
	// Only the last PowerSpeed without PSF_NOTRAIL set will actually draw the trail.
	for (AInventory *item = Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf(RUNTIME_CLASS(APowerSpeed)) &&
			!(static_cast<APowerSpeed *>(item)->SpeedFlags & PSF_NOTRAIL))
		{
			return;
		}
	}

	if (Owner->Vel.LengthSquared() <= 12*12)
		return;

	AActor *speedMo = Spawn<APlayerSpeedTrail> (Owner->Pos(), NO_REPLACE);
	if (speedMo)
	{
		speedMo->Angles.Yaw = Owner->Angles.Yaw;
		speedMo->Translation = Owner->Translation;
		speedMo->target = Owner;
		speedMo->sprite = Owner->sprite;
		speedMo->frame = Owner->frame;
		speedMo->Floorclip = Owner->Floorclip;

		// [BC] Also get the scale from the owner.
		speedMo->Scale = Owner->Scale;

		if (Owner == players[consoleplayer].camera &&
			!(Owner->player->cheats & CF_CHASECAM))
		{
			speedMo->renderflags |= RF_INVISIBLE;
		}
	}
}